

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Printer::RegisterMessagePrinter
          (Printer *this,Descriptor *descriptor,MessagePrinter *printer)

{
  _Base_ptr p_Var1;
  byte bVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>,_bool>
  pVar3;
  pair<const_google::protobuf::Descriptor_*,_std::nullptr_t> local_28;
  
  if (printer == (MessagePrinter *)0x0 || descriptor == (Descriptor *)0x0) {
    bVar2 = 0;
  }
  else {
    local_28.second = (void *)0x0;
    local_28.first = descriptor;
    pVar3 = std::
            _Rb_tree<google::protobuf::Descriptor_const*,std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,std::_Select1st<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>,std::less<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
            ::_M_emplace_unique<std::pair<google::protobuf::Descriptor_const*,decltype(nullptr)>>
                      ((_Rb_tree<google::protobuf::Descriptor_const*,std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,std::_Select1st<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>,std::less<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
                        *)&this->custom_message_printers_,&local_28);
    bVar2 = pVar3.second;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      p_Var1 = pVar3.first._M_node._M_node[1]._M_parent;
      pVar3.first._M_node._M_node[1]._M_parent = (_Base_ptr)printer;
      if (p_Var1 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)p_Var1 + 8))();
      }
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool TextFormat::Printer::RegisterMessagePrinter(
    const Descriptor* descriptor, const MessagePrinter* printer) {
  if (descriptor == nullptr || printer == nullptr) {
    return false;
  }
  auto pair =
      custom_message_printers_.insert(std::make_pair(descriptor, nullptr));
  if (pair.second) {
    pair.first->second.reset(printer);
    return true;
  } else {
    return false;
  }
}